

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::on_lsd_announce(session_impl *this,error_code *e)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  torrent *this_00;
  anon_class_8_1_8991fb9c local_48;
  duration<long,_std::ratio<1L,_1L>_> local_40;
  duration local_38;
  int local_2c [3];
  int local_20;
  int local_1c;
  error_code *peStack_18;
  int delay;
  error_code *e_local;
  session_impl *this_local;
  
  peStack_18 = e;
  e_local = (error_code *)this;
  counters::inc_stats_counter(&this->m_stats_counters,0x3c,1);
  bVar2 = boost::system::error_code::operator_cast_to_bool(peStack_18);
  if ((!bVar2) && ((this->m_abort & 1U) == 0)) {
    iVar3 = session_settings::get_int(&this->m_settings,0x4043);
    sVar4 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
    local_2c[2] = (int)sVar4;
    local_2c[1] = 1;
    piVar5 = ::std::max<int>(local_2c + 2,local_2c + 1);
    local_20 = iVar3 / *piVar5;
    local_2c[0] = 1;
    piVar5 = ::std::max<int>(&local_20,local_2c);
    local_1c = *piVar5;
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_40,&local_1c);
    ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_38,&local_40);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after(&this->m_lsd_announce_timer,&local_38);
    local_48.this = this;
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_wait<libtorrent::aux::session_impl::on_lsd_announce(boost::system::error_code_const&)::__0>
              ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&this->m_lsd_announce_timer,&local_48);
    bVar2 = torrent_list<libtorrent::aux::torrent>::empty(&this->m_torrents);
    if (!bVar2) {
      uVar1 = this->m_next_lsd_torrent;
      sVar4 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
      if (sVar4 <= uVar1) {
        this->m_next_lsd_torrent = 0;
      }
      this_00 = torrent_list<libtorrent::aux::torrent>::operator[]
                          (&this->m_torrents,this->m_next_lsd_torrent);
      torrent::lsd_announce(this_00);
      this->m_next_lsd_torrent = this->m_next_lsd_torrent + 1;
      uVar1 = this->m_next_lsd_torrent;
      sVar4 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
      if (sVar4 <= uVar1) {
        this->m_next_lsd_torrent = 0;
      }
    }
  }
  return;
}

Assistant:

void session_impl::on_lsd_announce(error_code const& e)
	{
		COMPLETE_ASYNC("session_impl::on_lsd_announce");
		m_stats_counters.inc_stats_counter(counters::on_lsd_counter);
		TORRENT_ASSERT(is_single_thread());
		if (e) return;

		if (m_abort) return;

		ADD_OUTSTANDING_ASYNC("session_impl::on_lsd_announce");
		// announce on local network every 5 minutes
		int const delay = std::max(m_settings.get_int(settings_pack::local_service_announce_interval)
			/ std::max(int(m_torrents.size()), 1), 1);
		m_lsd_announce_timer.expires_after(seconds(delay));
		m_lsd_announce_timer.async_wait([this](error_code const& err) {
			wrap(&session_impl::on_lsd_announce, err); });

		if (m_torrents.empty()) return;

		if (m_next_lsd_torrent >= m_torrents.size())
			m_next_lsd_torrent = 0;
		m_torrents[m_next_lsd_torrent]->lsd_announce();
		++m_next_lsd_torrent;
		if (m_next_lsd_torrent >= m_torrents.size())
			m_next_lsd_torrent = 0;
	}